

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O1

void HTS_PStream_calc_gv(HTS_PStream *pst,size_t m,double *mean,double *vari)

{
  size_t sVar1;
  HTS_Boolean *pHVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  
  *mean = 0.0;
  sVar1 = pst->length;
  if (sVar1 != 0) {
    pHVar2 = pst->gv_switch;
    sVar3 = 0;
    do {
      if (pHVar2[sVar3] != '\0') {
        *mean = pst->par[sVar3][m] + *mean;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  dVar4 = ((double)CONCAT44(0x45300000,(int)(pst->gv_length >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)pst->gv_length) - 4503599627370496.0);
  *mean = *mean / dVar4;
  *vari = 0.0;
  if (sVar1 != 0) {
    pHVar2 = pst->gv_switch;
    sVar3 = 0;
    do {
      if (pHVar2[sVar3] != '\0') {
        dVar5 = pst->par[sVar3][m] - *mean;
        *vari = dVar5 * dVar5 + *vari;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  *vari = *vari / dVar4;
  return;
}

Assistant:

static void HTS_PStream_calc_gv(HTS_PStream * pst, size_t m, double *mean, double *vari)
{
   size_t t;

   *mean = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *mean += pst->par[t][m];
   *mean /= pst->gv_length;
   *vari = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *vari += (pst->par[t][m] - *mean) * (pst->par[t][m] - *mean);
   *vari /= pst->gv_length;
}